

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_set_mute_mask_nsfplay(void *chip,UINT32 MuteMask)

{
  NESAPU_INF *info;
  UINT32 MuteMask_local;
  void *chip_local;
  
  NES_APU_np_SetMask(*(void **)((long)chip + 8),MuteMask & 3);
  NES_DMC_np_SetMask(*(void **)((long)chip + 0x10),(MuteMask & 0x1c) >> 2);
  if (*(long *)((long)chip + 0x18) != 0) {
    NES_FDS_SetMask(*(void **)((long)chip + 0x18),(MuteMask & 0x20) >> 5);
  }
  return;
}

Assistant:

static void nes_set_mute_mask_nsfplay(void* chip, UINT32 MuteMask)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	NES_APU_np_SetMask(info->chip_apu, (MuteMask & 0x03) >> 0);
	NES_DMC_np_SetMask(info->chip_dmc, (MuteMask & 0x1C) >> 2);
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		NES_FDS_SetMask(info->chip_fds, (MuteMask & 0x20) >> 5);
#endif
	
	return;
}